

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void disas_tpf(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  ushort uVar1;
  
  uVar1 = insn & 7;
  if (uVar1 != 4) {
    if (uVar1 != 3) {
      if (uVar1 == 2) {
        s->pc = s->pc + 2;
        return;
      }
      gen_exception(s,(s->base).pc_next,4);
      return;
    }
    s->pc = s->pc + 4;
  }
  return;
}

Assistant:

DISAS_INSN(tpf)
{
    switch (insn & 7) {
    case 2: /* One extension word.  */
        s->pc += 2;
        break;
    case 3: /* Two extension words.  */
        s->pc += 4;
        break;
    case 4: /* No extension words.  */
        break;
    default:
        disas_undef(env, s, insn);
    }
}